

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

bool genVulkanFunctionsPH
               (QList<VkSpecParser::Command> *commands,
               QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
               QString *outputBase)

{
  char cVar1;
  bool bVar2;
  QString *pQVar3;
  QString *key;
  char16_t *pcVar4;
  uint uVar5;
  Command *c;
  Command *str;
  uint uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QList<VkSpecParser::Command> *__range2;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<const_QString_&,_QString> local_80;
  QArrayDataPointer<char16_t> local_60;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_b0.d = (Data *)0x0;
  local_b0.ptr = (char16_t *)0x0;
  local_b0.size = 0;
  local_98.d = (Data *)0x0;
  local_80.b.d.d._0_4_ = 0;
  local_80.b.d.d._4_4_ = 0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  local_80.b.d.ptr._0_4_ = 0x10a1ca;
  local_80.b.d.ptr._4_4_ = 0;
  local_80.b.d.size = 4;
  local_80.a = outputBase;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>((QString *)&local_60,&local_80);
  QFile::QFile((QFile *)&local_48,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  cVar1 = QFile::open((QFile *)&local_48,0x12);
  if (cVar1 == '\0') {
    local_80.a._0_4_ = 2;
    local_80.b.d.ptr._4_4_ = 0;
    local_80.a._4_4_ = 0;
    local_80.b.d.d._0_4_ = 0;
    local_80.b.d.d._4_4_ = 0;
    local_80.b.d.ptr._0_4_ = 0;
    local_80.b.d.size = 0x10ab99;
    QFile::fileName();
    QString::toLocal8Bit((QByteArray *)&local_60,(QString *)&local_98);
    if (local_60.ptr == (char16_t *)0x0) {
      local_60.ptr = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::warning((char *)&local_80,"Failed to write %s",local_60.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  else {
    pQVar3 = VERSIONS.d.ptr + VERSIONS.d.size;
    uVar5 = 0;
    uVar6 = 0;
    for (key = VERSIONS.d.ptr; key != pQVar3; key = key + 1) {
      QMap<QString,_QList<QString>_>::operator[]
                ((QList<QString> *)&local_80,versionCommandMapping,key);
      str = (commands->d).ptr;
      for (lVar7 = (commands->d).size * 0x68; lVar7 != 0; lVar7 = lVar7 + -0x68) {
        bVar2 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)&local_80,(QString *)str,CaseSensitive);
        if (bVar2) {
          uVar6 = uVar6 + str->deviceLevel;
          uVar5 = uVar5 + (str->deviceLevel ^ 1);
        }
        str = str + 1;
      }
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_80);
    }
    Preamble::get((QByteArray *)&local_98,&preamble,licHeaderFn);
    pcVar4 = local_98.ptr;
    if (local_98.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QByteArray::_empty;
    }
    QString::asprintf((char *)&local_60,
                      "%s\n#ifndef QVULKANFUNCTIONS_P_H\n#define QVULKANFUNCTIONS_P_H\n\n//\n//  W A R N I N G\n//  -------------\n//\n// This file is not part of the Qt API.  It exists purely as an\n// implementation detail.  This header file may change from version to\n// version without notice, or even be removed.\n//\n// We mean it.\n//\n\n#include \"qvulkanfunctions.h\"\n\nQT_BEGIN_NAMESPACE\n\nclass QVulkanInstance;\n\nclass QVulkanFunctionsPrivate\n{\npublic:\n    QVulkanFunctionsPrivate(QVulkanInstance *inst);\n\n    PFN_vkVoidFunction m_funcs[%d];\n};\n\nclass QVulkanDeviceFunctionsPrivate\n{\npublic:\n    QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device);\n\n    PFN_vkVoidFunction m_funcs[%d];\n};\n\nQT_END_NAMESPACE\n\n#endif // QVULKANFUNCTIONS_P_H\n"
                      ,pcVar4,(ulong)uVar5,(ulong)uVar6);
    QString::toUtf8_helper((QString *)&local_80);
    QIODevice::write(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool genVulkanFunctionsPH(const QList<VkSpecParser::Command> &commands,
                          const QMap<QString, QStringList> &versionCommandMapping,
                          const QString &licHeaderFn,
                          const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral("_p.h"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char *s =
"%s\n"
"#ifndef QVULKANFUNCTIONS_P_H\n"
"#define QVULKANFUNCTIONS_P_H\n"
"\n"
"//\n"
"//  W A R N I N G\n"
"//  -------------\n"
"//\n"
"// This file is not part of the Qt API.  It exists purely as an\n"
"// implementation detail.  This header file may change from version to\n"
"// version without notice, or even be removed.\n"
"//\n"
"// We mean it.\n"
"//\n"
"\n"
"#include \"qvulkanfunctions.h\"\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n"
"class QVulkanInstance;\n"
"\n"
"class QVulkanFunctionsPrivate\n"
"{\n"
"public:\n"
"    QVulkanFunctionsPrivate(QVulkanInstance *inst);\n"
"\n"
"    PFN_vkVoidFunction m_funcs[%d];\n"
"};\n"
"\n"
"class QVulkanDeviceFunctionsPrivate\n"
"{\n"
"public:\n"
"    QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device);\n"
"\n"
"    PFN_vkVoidFunction m_funcs[%d];\n"
"};\n"
"\n"
"QT_END_NAMESPACE\n"
"\n"
"#endif // QVULKANFUNCTIONS_P_H\n";

    int devLevelCount = 0;
    int instLevelCount = 0;
    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            if (c.deviceLevel)
                devLevelCount += 1;
            else
                instLevelCount += 1;
        }
    }

    f.write(QString::asprintf(s, preamble.get(licHeaderFn).constData(), instLevelCount, devLevelCount).toUtf8());

    return true;
}